

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *val)

{
  byte bVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  string local_38;
  
  for (; bVar1 = (byte)(this->field_0).json_ref_ & 0xf, bVar1 == 9;
      this = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)&this->field_0 + 8)) {
  }
  if (bVar1 == 0xe) {
    std::
    vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
    ::
    emplace_back<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              ((vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                *)(*(long *)((long)&this->field_0 + 8) + 8),val);
    return;
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Attempting to insert into a value that is not an array","");
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

void push_back(basic_json&& val)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().push_back(std::move(val));
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().push_back(std::move(val));
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }